

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cc
# Opt level: O2

OutputFile * __thiscall re2c::OutputFile::wu32_hex(OutputFile *this,uint32_t n)

{
  prtHex((ostream *)
         &((this->blocks).
           super__Vector_base<re2c::OutputBlock_*,_std::allocator<re2c::OutputBlock_*>_>._M_impl.
           super__Vector_impl_data._M_finish[-1]->fragments).
          super__Vector_base<re2c::OutputFragment_*,_std::allocator<re2c::OutputFragment_*>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1]->stream,n);
  return this;
}

Assistant:

OutputFile & OutputFile::wu32_hex (uint32_t n)
{
	prtHex (stream (), n);
	return *this;
}